

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd_huffman.c
# Opt level: O0

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs,uint8_t *src,size_t srclen)

{
  uint32_t uVar1;
  int iVar2;
  byte *pbVar3;
  long in_RDX;
  byte *in_RSI;
  long in_RDI;
  int rv;
  size_t avail;
  size_t nbits;
  uint32_t x;
  uint64_t code;
  uint8_t *end;
  nghttp2_huff_sym *sym;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  ulong local_50;
  ulong local_48;
  ulong local_38;
  byte *local_18;
  int local_4;
  
  local_38 = 0;
  local_48 = 0;
  local_50 = *(long *)(*(long *)(in_RDI + 8) + 0x10) - *(long *)(*(long *)(in_RDI + 8) + 0x20);
  local_18 = in_RSI;
  while (local_18 != in_RSI + in_RDX) {
    pbVar3 = local_18 + 1;
    local_38 = (ulong)huff_sym_table[*local_18].code << (0x20U - (char)local_48 & 0x3f) | local_38;
    local_48 = huff_sym_table[*local_18].nbits + local_48;
    local_18 = pbVar3;
    if (0x1f < local_48) {
      if (local_50 < 4) {
        for (; 7 < local_48; local_48 = local_48 - 8) {
          iVar2 = nghttp2_bufs_addb((nghttp2_bufs *)
                                    CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                    '\0');
          if (iVar2 != 0) {
            return iVar2;
          }
          local_38 = local_38 << 8;
          in_stack_ffffffffffffffac = 0;
        }
        local_50 = *(long *)(*(long *)(in_RDI + 8) + 0x10) - *(long *)(*(long *)(in_RDI + 8) + 0x20)
        ;
      }
      else {
        uVar1 = htonl((uint32_t)(local_38 >> 0x20));
        **(uint32_t **)(*(long *)(in_RDI + 8) + 0x20) = uVar1;
        *(long *)(*(long *)(in_RDI + 8) + 0x20) = *(long *)(*(long *)(in_RDI + 8) + 0x20) + 4;
        local_50 = local_50 - 4;
        local_38 = local_38 << 0x20;
        local_48 = local_48 - 0x20;
      }
    }
  }
  while( true ) {
    if (local_48 < 8) {
      if ((local_48 == 0) ||
         (local_4 = nghttp2_bufs_addb((nghttp2_bufs *)
                                      CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                                      '\0'), local_4 == 0)) {
        local_4 = 0;
      }
      return local_4;
    }
    iVar2 = nghttp2_bufs_addb((nghttp2_bufs *)
                              CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),'\0');
    if (iVar2 != 0) break;
    local_48 = local_48 - 8;
    in_stack_ffffffffffffffac = 0;
  }
  return iVar2;
}

Assistant:

int nghttp2_hd_huff_encode(nghttp2_bufs *bufs, const uint8_t *src,
                           size_t srclen) {
  const nghttp2_huff_sym *sym;
  const uint8_t *end = src + srclen;
  uint64_t code = 0;
  uint32_t x;
  size_t nbits = 0;
  size_t avail;
  int rv;

  avail = nghttp2_bufs_cur_avail(bufs);

  for (; src != end;) {
    sym = &huff_sym_table[*src++];
    code |= (uint64_t)sym->code << (32 - nbits);
    nbits += sym->nbits;
    if (nbits < 32) {
      continue;
    }
    if (avail >= 4) {
      x = htonl((uint32_t)(code >> 32));
      memcpy(bufs->cur->buf.last, &x, 4);
      bufs->cur->buf.last += 4;
      avail -= 4;
      code <<= 32;
      nbits -= 32;
      continue;
    }

    for (; nbits >= 8;) {
      rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
      if (rv != 0) {
        return rv;
      }
      code <<= 8;
      nbits -= 8;
    }

    avail = nghttp2_bufs_cur_avail(bufs);
  }

  for (; nbits >= 8;) {
    rv = nghttp2_bufs_addb(bufs, (uint8_t)(code >> 56));
    if (rv != 0) {
      return rv;
    }
    code <<= 8;
    nbits -= 8;
  }

  if (nbits) {
    rv = nghttp2_bufs_addb(
      bufs, (uint8_t)((uint8_t)(code >> 56) | ((1 << (8 - nbits)) - 1)));
    if (rv != 0) {
      return rv;
    }
  }

  return 0;
}